

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncoderAnalyze(VP8LEncoder *enc,CrunchConfig *crunch_configs,int *crunch_configs_size,
                  int *red_and_blue_always_zero)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int j;
  PaletteSorting typed_sorting_method;
  int sorting_method;
  EntropyIx min_entropy_ix;
  int do_no_cache;
  int n_lz77s;
  int transform_bits;
  int use_palette;
  int i;
  int low_effort;
  int method;
  WebPConfig *config;
  int height;
  int width;
  WebPPicture *pic;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  uint32_t *in_stack_00000098;
  int in_stack_000000b0;
  EntropyIx *in_stack_000000b8;
  int *in_stack_000000c0;
  uint32_t *in_stack_000013a0;
  WebPPicture *in_stack_000013a8;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  int local_6c;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_4c;
  
  lVar1 = *in_RDI;
  iVar6 = *(int *)(lVar1 + 8);
  iVar5 = *(int *)(lVar1 + 8);
  local_5c = 0;
  iVar4 = GetColorPalette(in_stack_000013a8,in_stack_000013a0);
  *(int *)((long)in_RDI + 100) = iVar4;
  bVar2 = *(int *)((long)in_RDI + 100) < 0x101;
  if (!bVar2) {
    *(undefined4 *)((long)in_RDI + 100) = 0;
  }
  iVar4 = GetHistoBits((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       in_stack_ffffffffffffff78);
  *(int *)((long)in_RDI + 0x44) = iVar4;
  iVar4 = GetTransformBits(iVar6,*(int *)((long)in_RDI + 0x44));
  *(int *)(in_RDI + 9) = iVar4;
  *(int *)((long)in_RDI + 0x4c) = iVar4;
  if (iVar5 == 0) {
    iVar6 = 3;
    if (bVar2) {
      iVar6 = 4;
    }
    *in_RSI = iVar6;
    iVar6 = 3;
    if (bVar2) {
      iVar6 = 0;
    }
    in_RSI[1] = iVar6;
    local_58 = 1;
    *in_RDX = 1;
  }
  else {
    bVar3 = false;
    if (0 < *(int *)((long)in_RDI + 100)) {
      bVar3 = *(int *)((long)in_RDI + 100) < 0x11;
    }
    local_58 = 1;
    if (bVar3) {
      local_58 = 2;
    }
    iVar5 = AnalyzeEntropy(in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_0000008c,
                           in_stack_00000088,in_stack_00000084,in_stack_000000b0,in_stack_000000b8,
                           in_stack_000000c0);
    if (iVar5 == 0) {
      return 0;
    }
    if (((iVar6 != 6) || (*(float *)(lVar1 + 4) != 100.0)) || (NAN(*(float *)(lVar1 + 4)))) {
      *in_RDX = 1;
      *in_RSI = local_60;
      iVar5 = 3;
      if (bVar2) {
        iVar5 = 1;
      }
      in_RSI[1] = iVar5;
      if (((75.0 <= *(float *)(lVar1 + 4)) && (iVar6 == 5)) && (local_5c = 1, local_60 == 4)) {
        *in_RDX = 2;
        in_RSI[7] = 5;
        in_RSI[8] = 1;
      }
    }
    else {
      local_5c = 1;
      *in_RDX = 0;
      for (local_4c = 0; local_4c < 6; local_4c = local_4c + 1) {
        if (((local_4c != 4) && (local_4c != 5)) || (bVar2)) {
          if ((bVar2) && ((local_4c == 4 || (local_4c == 5)))) {
            for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
              if ((local_64 != 3) && (local_64 != 0)) {
                in_RSI[(long)*in_RDX * 7] = local_4c;
                in_RSI[(long)*in_RDX * 7 + 1] = local_64;
                *in_RDX = *in_RDX + 1;
              }
            }
          }
          else {
            in_RSI[(long)*in_RDX * 7] = local_4c;
            in_RSI[(long)*in_RDX * 7 + 1] = 3;
            *in_RDX = *in_RDX + 1;
          }
        }
      }
    }
  }
  for (local_4c = 0; local_4c < *in_RDX; local_4c = local_4c + 1) {
    for (local_6c = 0; local_6c < local_58; local_6c = local_6c + 1) {
      iVar6 = 4;
      if (local_6c == 0) {
        iVar6 = 3;
      }
      in_RSI[(long)local_4c * 7 + (long)local_6c * 2 + 2] = iVar6;
      in_RSI[(long)local_4c * 7 + (long)local_6c * 2 + 3] = local_5c;
    }
    in_RSI[(long)local_4c * 7 + 6] = local_58;
  }
  return 1;
}

Assistant:

static int EncoderAnalyze(VP8LEncoder* const enc,
                          CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX],
                          int* const crunch_configs_size,
                          int* const red_and_blue_always_zero) {
  const WebPPicture* const pic = enc->pic_;
  const int width = pic->width;
  const int height = pic->height;
  const WebPConfig* const config = enc->config_;
  const int method = config->method;
  const int low_effort = (config->method == 0);
  int i;
  int use_palette, transform_bits;
  int n_lz77s;
  // If set to 0, analyze the cache with the computed cache value. If 1, also
  // analyze with no-cache.
  int do_no_cache = 0;
  assert(pic != NULL && pic->argb != NULL);

  // Check whether a palette is possible.
  enc->palette_size_ = GetColorPalette(pic, enc->palette_sorted_);
  use_palette = (enc->palette_size_ <= MAX_PALETTE_SIZE);
  if (!use_palette) {
    enc->palette_size_ = 0;
  }

  // Empirical bit sizes.
  enc->histo_bits_ = GetHistoBits(method, use_palette,
                                  pic->width, pic->height);
  transform_bits = GetTransformBits(method, enc->histo_bits_);
  enc->predictor_transform_bits_ = transform_bits;
  enc->cross_color_transform_bits_ = transform_bits;

  if (low_effort) {
    // AnalyzeEntropy is somewhat slow.
    crunch_configs[0].entropy_idx_ = use_palette ? kPalette : kSpatialSubGreen;
    crunch_configs[0].palette_sorting_type_ =
        use_palette ? kSortedDefault : kUnusedPalette;
    n_lz77s = 1;
    *crunch_configs_size = 1;
  } else {
    EntropyIx min_entropy_ix;
    // Try out multiple LZ77 on images with few colors.
    n_lz77s = (enc->palette_size_ > 0 && enc->palette_size_ <= 16) ? 2 : 1;
    if (!AnalyzeEntropy(pic->argb, width, height, pic->argb_stride, use_palette,
                        enc->palette_size_, transform_bits, &min_entropy_ix,
                        red_and_blue_always_zero)) {
      return 0;
    }
    if (method == 6 && config->quality == 100) {
      do_no_cache = 1;
      // Go brute force on all transforms.
      *crunch_configs_size = 0;
      for (i = 0; i < kNumEntropyIx; ++i) {
        // We can only apply kPalette or kPaletteAndSpatial if we can indeed use
        // a palette.
        if ((i != kPalette && i != kPaletteAndSpatial) || use_palette) {
          assert(*crunch_configs_size < CRUNCH_CONFIGS_MAX);
          if (use_palette && (i == kPalette || i == kPaletteAndSpatial)) {
            int sorting_method;
            for (sorting_method = 0; sorting_method < kPaletteSortingNum;
                 ++sorting_method) {
              const PaletteSorting typed_sorting_method =
                  (PaletteSorting)sorting_method;
              // TODO(vrabaud) kSortedDefault should be tested. It is omitted
              // for now for backward compatibility.
              if (typed_sorting_method == kUnusedPalette ||
                  typed_sorting_method == kSortedDefault) {
                continue;
              }
              crunch_configs[(*crunch_configs_size)].entropy_idx_ = i;
              crunch_configs[(*crunch_configs_size)].palette_sorting_type_ =
                  typed_sorting_method;
              ++*crunch_configs_size;
            }
          } else {
            crunch_configs[(*crunch_configs_size)].entropy_idx_ = i;
            crunch_configs[(*crunch_configs_size)].palette_sorting_type_ =
                kUnusedPalette;
            ++*crunch_configs_size;
          }
        }
      }
    } else {
      // Only choose the guessed best transform.
      *crunch_configs_size = 1;
      crunch_configs[0].entropy_idx_ = min_entropy_ix;
      crunch_configs[0].palette_sorting_type_ =
          use_palette ? kMinimizeDelta : kUnusedPalette;
      if (config->quality >= 75 && method == 5) {
        // Test with and without color cache.
        do_no_cache = 1;
        // If we have a palette, also check in combination with spatial.
        if (min_entropy_ix == kPalette) {
          *crunch_configs_size = 2;
          crunch_configs[1].entropy_idx_ = kPaletteAndSpatial;
          crunch_configs[1].palette_sorting_type_ = kMinimizeDelta;
        }
      }
    }
  }
  // Fill in the different LZ77s.
  assert(n_lz77s <= CRUNCH_SUBCONFIGS_MAX);
  for (i = 0; i < *crunch_configs_size; ++i) {
    int j;
    for (j = 0; j < n_lz77s; ++j) {
      assert(j < CRUNCH_SUBCONFIGS_MAX);
      crunch_configs[i].sub_configs_[j].lz77_ =
          (j == 0) ? kLZ77Standard | kLZ77RLE : kLZ77Box;
      crunch_configs[i].sub_configs_[j].do_no_cache_ = do_no_cache;
    }
    crunch_configs[i].sub_configs_size_ = n_lz77s;
  }
  return 1;
}